

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cClipDistance.cpp
# Opt level: O2

IterateResult __thiscall gl3cts::ClipDistance::FunctionalTest::iterate(FunctionalTest *this)

{
  GLenum primitive_type;
  GLuint count;
  bool bVar1;
  int iVar2;
  ContextType ctxType;
  uint uVar3;
  undefined4 extraout_var;
  char *pcVar4;
  VertexBufferObject<float> *this_00;
  MessageBuilder *pMVar5;
  NotSupportedError *this_01;
  socklen_t __len;
  sockaddr *__addr;
  uint uVar6;
  Functions *pFVar7;
  FunctionalTest *this_02;
  FunctionalTest *pFVar8;
  long lVar9;
  long lVar10;
  VertexArrayObject vertex_array_object;
  Framebuffer framebuffer;
  string vertex_shader_code;
  Enum<int,_2UL> local_318;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_308;
  vector<float,_std::allocator<float>_> results;
  Program program;
  undefined1 local_250 [8];
  ostream local_248;
  string local_d0;
  Program local_b0;
  Functions *gl;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar2);
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x103);
  if (!bVar1) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_250,"GL_ARB_clip_distance is not supported",
               (allocator<char> *)&program);
    tcu::NotSupportedError::NotSupportedError(this_01,(string *)local_250);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  lVar10 = 0;
  do {
    if (lVar10 == 3) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
      return STOP;
    }
    primitive_type = m_primitive_types[lVar10];
    count = m_primitive_indices[lVar10];
    __len = 0x20;
    if (primitive_type == 0) {
      __len = 1;
    }
    pFVar7 = gl;
    Utility::Framebuffer::Framebuffer(&framebuffer,gl,__len,__len);
    Utility::Framebuffer::bind(&framebuffer,(int)pFVar7,__addr,__len);
    for (lVar9 = 0; lVar9 != 4 - (ulong)(lVar10 == 0); lVar9 = lVar9 + 1) {
      this_02 = (FunctionalTest *)0x0;
      while (iVar2 = (int)this_02, iVar2 != 2) {
        pcVar4 = " without ";
        if (iVar2 == 1) {
          pcVar4 = " with ";
        }
        uVar6 = 1;
        while (uVar3 = this->m_gl_max_clip_distances_value, uVar6 <= uVar3) {
          prepareVertexShaderCode_abi_cxx11_
                    (&vertex_shader_code,this_02,iVar2 == 1,iVar2 == 1,uVar6,(GLuint)lVar9,
                     primitive_type);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_250,m_fragment_shader_code,(allocator<char> *)&results);
          local_308.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_308.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_308.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          Utility::Program::Program(&program,gl,&vertex_shader_code,(string *)local_250,&local_308);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_308);
          std::__cxx11::string::~string((string *)local_250);
          if (program.m_program_status.program_id == 0) {
            local_250 = (undefined1  [8])
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_248);
            std::operator<<(&local_248,
                            "Functional test have failed when building program.\nVertex shader code:\n"
                           );
            std::operator<<(&local_248,(string *)&vertex_shader_code);
            std::operator<<(&local_248,"\nFragment shader code:\n");
            pMVar5 = tcu::MessageBuilder::operator<<
                               ((MessageBuilder *)local_250,&m_fragment_shader_code);
            std::operator<<(&(pMVar5->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"\n"
                           );
            tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_248);
            tcu::TestContext::setTestResult
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                       QP_TEST_RESULT_FAIL,"Fail");
LAB_00ae91fc:
            Utility::Program::~Program(&program);
            std::__cxx11::string::~string((string *)&vertex_shader_code);
            goto LAB_00ae9216;
          }
          Utility::Program::UseProgram(&program);
          Utility::Framebuffer::clear(&framebuffer);
          (*gl->enable)(uVar6 + 0x2fff);
          pFVar8 = (FunctionalTest *)&vertex_array_object;
          Utility::VertexArrayObject::VertexArrayObject
                    ((VertexArrayObject *)pFVar8,gl,primitive_type);
          this_00 = prepareGeometry(pFVar8,gl,primitive_type);
          Utility::Program::Program(&local_b0,&program);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_d0,"position",(allocator<char> *)local_250);
          bVar1 = Utility::VertexBufferObject<float>::useAsShaderInput
                            (this_00,&local_b0,&local_d0,4);
          std::__cxx11::string::~string((string *)&local_d0);
          Utility::Program::~Program(&local_b0);
          if (!bVar1) {
            local_250 = (undefined1  [8])
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_248);
            std::operator<<(&local_248,
                            "Functional test have failed when enabling vertex attribute array.\n");
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_250,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_248);
            tcu::TestContext::setTestResult
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                       QP_TEST_RESULT_INTERNAL_ERROR,"Error");
            Utility::VertexBufferObject<float>::~VertexBufferObject(this_00);
            operator_delete(this_00,0x30);
            Utility::VertexArrayObject::~VertexArrayObject(&vertex_array_object);
            goto LAB_00ae91fc;
          }
          Utility::VertexArrayObject::draw(&vertex_array_object,0,count);
          pFVar8 = (FunctionalTest *)&results;
          Utility::Framebuffer::readPixels(&results,&framebuffer);
          bVar1 = checkResults(pFVar8,primitive_type,(GLuint)lVar9,&results);
          if (!bVar1) {
            local_250 = (undefined1  [8])
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_248);
            std::operator<<(&local_248,"Functional test have failed when drawing ");
            local_318.m_getName = glu::getPrimitiveTypeName;
            local_318.m_value = primitive_type;
            tcu::Format::Enum<int,_2UL>::toStream(&local_318,&local_248);
            std::operator<<(&local_248,pcVar4);
            std::operator<<(&local_248,"dynamic redeclaration, when ");
            std::ostream::_M_insert<unsigned_long>((ulong)&local_248);
            std::operator<<(&local_248,
                            " GL_CLIP_DISTANCES where enabled and set up using function:\n");
            pMVar5 = tcu::MessageBuilder::operator<<
                               ((MessageBuilder *)local_250,m_clip_function + lVar9);
            tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_248);
            tcu::TestContext::setTestResult
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                       QP_TEST_RESULT_FAIL,"Fail");
          }
          Utility::VertexBufferObject<float>::~VertexBufferObject(this_00);
          operator_delete(this_00,0x30);
          std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                    (&results.super__Vector_base<float,_std::allocator<float>_>);
          Utility::VertexArrayObject::~VertexArrayObject(&vertex_array_object);
          Utility::Program::~Program(&program);
          std::__cxx11::string::~string((string *)&vertex_shader_code);
          uVar6 = uVar6 + 1;
          if (!bVar1) {
LAB_00ae9216:
            Utility::Framebuffer::~Framebuffer(&framebuffer);
            return STOP;
          }
        }
        for (uVar6 = 0; uVar6 < uVar3; uVar6 = uVar6 + 1) {
          (*gl->disable)(uVar6 + 0x3000);
          uVar3 = this->m_gl_max_clip_distances_value;
        }
        this_02 = (FunctionalTest *)(ulong)(iVar2 + 1);
      }
    }
    Utility::Framebuffer::~Framebuffer(&framebuffer);
    lVar10 = lVar10 + 1;
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult gl3cts::ClipDistance::FunctionalTest::iterate()
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* This test should only be executed if we're running a GL>=3.0 context */
	if (!glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(3, 0)))
	{
		throw tcu::NotSupportedError("GL_ARB_clip_distance is not supported");
	}

	/* Functional test */

	/* For all primitive modes. */
	for (glw::GLuint i_primitive_type = 0; i_primitive_type < m_primitive_types_count; ++i_primitive_type)
	{
		glw::GLenum primitive_type			= m_primitive_types[i_primitive_type];
		glw::GLenum primitive_indices_count = m_primitive_indices[i_primitive_type];

		/* Framebuffer setup. */
		glw::GLuint framebuffer_size = (primitive_type == GL_POINTS) ? 1 : 32;

		gl3cts::ClipDistance::Utility::Framebuffer framebuffer(gl, framebuffer_size,
															   framebuffer_size); /* Framebuffer shall be square */

		framebuffer.bind();

		/* For all clip combinations. */
		for (glw::GLuint i_clip_function = 0;
			 i_clip_function <
			 m_clip_function_count -
				 int(i_primitive_type == GL_POINTS); /* Do not use last clip function with GL_POINTS. */
			 ++i_clip_function)
		{
			/* For both redeclaration types (implicit/explicit). */
			for (glw::GLuint i_redeclaration = 0; i_redeclaration < 2; ++i_redeclaration)
			{
				bool redeclaration = (i_redeclaration == 1);

				/* For different clip array sizes. */
				for (glw::GLuint i_clip_count = 1; i_clip_count <= glw::GLuint(m_gl_max_clip_distances_value);
					 ++i_clip_count)
				{
					/* Create and build program. */
					std::string vertex_shader_code = gl3cts::ClipDistance::FunctionalTest::prepareVertexShaderCode(
						redeclaration, redeclaration, i_clip_count, i_clip_function, primitive_type);

					gl3cts::ClipDistance::Utility::Program program(gl, vertex_shader_code, m_fragment_shader_code);

					if (program.ProgramStatus().program_id == GL_NONE)
					{
						/* Result's setup. */
						m_testCtx.getLog()
							<< tcu::TestLog::Message
							<< "Functional test have failed when building program.\nVertex shader code:\n"
							<< vertex_shader_code << "\nFragment shader code:\n"
							<< m_fragment_shader_code << "\n"
							<< tcu::TestLog::EndMessage;

						m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");

						return STOP;
					}

					program.UseProgram();

					/* Framebuffer clear */
					framebuffer.clear();

					/* Clip setup */
					gl.enable(GL_CLIP_DISTANCE0 + i_clip_count - 1);

					/* Geometry Setup */
					gl3cts::ClipDistance::Utility::VertexArrayObject vertex_array_object(gl, primitive_type);

					gl3cts::ClipDistance::Utility::VertexBufferObject<glw::GLfloat>* vertex_buffer_object =
						prepareGeometry(gl, primitive_type);

					if (!vertex_buffer_object->useAsShaderInput(program, "position", 4))
					{
						/* Result's setup. */
						m_testCtx.getLog() << tcu::TestLog::Message
										   << "Functional test have failed when enabling vertex attribute array.\n"
										   << tcu::TestLog::EndMessage;

						m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");

						delete vertex_buffer_object;
						return STOP;
					}

					/* Draw geometry to the framebuffer */
					vertex_array_object.draw(0, primitive_indices_count);

					/* Check results */
					std::vector<glw::GLfloat> results = framebuffer.readPixels();

					if (!checkResults(primitive_type, i_clip_function, results))
					{
						/* Result's setup. */
						m_testCtx.getLog() << tcu::TestLog::Message << "Functional test have failed when drawing "
										   << glu::getPrimitiveTypeStr(primitive_type)
										   << ((redeclaration) ? " with " : " without ")
										   << "dynamic redeclaration, when " << i_clip_count
										   << " GL_CLIP_DISTANCES where enabled and set up using function:\n"
										   << m_clip_function[i_clip_function] << tcu::TestLog::EndMessage;

						m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");

						delete vertex_buffer_object;
						return STOP;
					}

					delete vertex_buffer_object;
				}

				/* Clip clean */
				for (glw::GLuint i_clip_count = 0; i_clip_count < glw::GLuint(m_gl_max_clip_distances_value);
					 ++i_clip_count)
				{
					gl.disable(GL_CLIP_DISTANCE0 + i_clip_count);
				}
			}
		}
	}

	/* Result's setup. */

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}